

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

int __thiscall
opengv::absolute_pose::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  ulong uVar1;
  int iVar2;
  Scalar *pSVar3;
  size_t sVar4;
  Scalar *pSVar5;
  double *in_RDI;
  Scalar SVar6;
  double factor;
  point_t reprojection;
  point_t bodyReprojection;
  size_t i;
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  transformation_t inverseSolution;
  rotation_t rotation;
  cayley_t cayley;
  translation_t translation;
  DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  Index in_stack_fffffffffffffb70;
  Indices *this_00;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffb78;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>_>
  *in_stack_fffffffffffffb80;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *this_01;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffb88;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffb90;
  dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
  *in_stack_fffffffffffffb98;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffbb0;
  undefined1 local_3f0 [48];
  undefined1 local_3c0 [72];
  non_const_type local_378;
  cayley_t *in_stack_fffffffffffffc90;
  undefined1 local_2e0 [24];
  ulong local_2c8;
  non_const_type local_188;
  
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70,CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
            );
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffffb60);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70,CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
            );
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffffb60);
  math::cayley2rot(in_stack_fffffffffffffc90);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x7bc45a);
  local_188 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffffb60);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70,CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
            );
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             in_stack_fffffffffffffb60);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70,CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
            );
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_> *)
             in_stack_fffffffffffffb80);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>>
  ::operator*(in_stack_fffffffffffffb80,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb78);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),in_stack_fffffffffffffb60
            );
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7bc52a);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                      CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                      (Index)in_stack_fffffffffffffb60);
  *pSVar3 = 1.0;
  local_2c8 = 0;
  while( true ) {
    uVar1 = local_2c8;
    sVar4 = Indices::size((Indices *)in_RDI[2]);
    if (sVar4 <= uVar1) break;
    this_00 = (Indices *)in_RDI[1];
    iVar2 = Indices::operator[](this_00,in_stack_fffffffffffffb6c);
    (**(code **)(*(long *)this_00 + 0x30))(local_2e0,this_00,(long)iVar2);
    Eigen::DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffffb78,
               (Index)this_00,CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_3,_1,_false> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb60);
    Eigen::MatrixBase<Eigen::Matrix<double,3,4,0,3,4>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffffb60);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb78 =
         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)in_RDI[1];
    iVar2 = Indices::operator[](this_00,in_stack_fffffffffffffb6c);
    (**(code **)(*(long *)in_stack_fffffffffffffb78 + 0x28))
              (local_3c0,in_stack_fffffffffffffb78,(long)iVar2);
    local_378 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           in_stack_fffffffffffffb60);
    this_01 = (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)in_RDI[1];
    iVar2 = Indices::operator[](this_00,in_stack_fffffffffffffb6c);
    (**(code **)(*(long *)this_01 + 0x20))(local_3f0,this_01,(long)iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (this_01,in_stack_fffffffffffffb78);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffffb60);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb60);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(in_stack_fffffffffffffbb0,in_RDI);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb90 =
         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x3ff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb88 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI[1];
    iVar2 = Indices::operator[](this_00,in_stack_fffffffffffffb6c);
    (**(code **)(*(long *)in_stack_fffffffffffffb88 + 0x10))
              (&stack0xfffffffffffffbb0,in_stack_fffffffffffffb88,(long)iVar2);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
              ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb60);
    SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_fffffffffffffb98);
    in_stack_fffffffffffffb98 =
         (dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
          *)((double)in_stack_fffffffffffffb90 * (1.0 - SVar6));
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                        (Index)in_stack_fffffffffffffb60);
    *pSVar5 = (Scalar)in_stack_fffffffffffffb98;
    local_2c8 = local_2c8 + 1;
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    translation_t translation = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    rotation_t rotation = math::cayley2rot(cayley);

    //compute inverse transformation
    transformation_t inverseSolution;
    inverseSolution.block<3,3>(0,0) = rotation.transpose();
    inverseSolution.col(3) = -inverseSolution.block<3,3>(0,0)*translation;

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for(size_t i = 0; i < _indices.size(); i++)
    {
      //get point in homogeneous form
      p_hom.block<3,1>(0,0) = _adapter.getPoint(_indices[i]);

      //compute the reprojection (this is working for both central and
      //non-central case)
      point_t bodyReprojection = inverseSolution * p_hom;
      point_t reprojection = _adapter.getCamRotation(_indices[i]).transpose() *
          (bodyReprojection - _adapter.getCamOffset(_indices[i]));
      reprojection = reprojection / reprojection.norm();

      //compute the score
      double factor = 1.0;
      fvec[i] = factor *
          (1.0 -
          (reprojection.transpose() * _adapter.getBearingVector(_indices[i])));
    }

    return 0;
  }